

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::DoesFileExistWithExtensions
               (string *name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *headerExts)

{
  pointer pbVar1;
  bool bVar2;
  string *headerExt;
  pointer pbVar3;
  bool bVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string hname;
  string local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  undefined8 local_a0;
  undefined1 *local_98;
  size_type local_90;
  pointer local_88;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  pbVar3 = (headerExts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (headerExts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = pbVar3 != pbVar1;
  if (bVar4) {
    do {
      local_b0._M_str = (name->_M_dataplus)._M_p;
      local_b0._M_len = name->_M_string_length;
      local_60 = 1;
      local_98 = local_50;
      local_50[0] = 0x2e;
      local_a0 = 1;
      local_88 = (pbVar3->_M_dataplus)._M_p;
      local_90 = pbVar3->_M_string_length;
      views._M_len = 3;
      views._M_array = &local_b0;
      local_58 = local_98;
      cmCatViews_abi_cxx11_(&local_80,views);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar2 = cmsys::SystemTools::FileExists(&local_d0);
      if (bVar2) break;
      pbVar3 = pbVar3 + 1;
      bVar4 = pbVar3 != pbVar1;
    } while (bVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = cmStrCat('[', key, ']');
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}